

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *
Catch::sortTests(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                 *__return_storage_ptr__,IConfig *config,
                vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                *unsortedTestCases)

{
  pointer *ppTVar1;
  pointer pTVar2;
  iterator __position;
  long lVar3;
  ITestInvoker *pIVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  int iVar7;
  uint uVar8;
  uint32_t uVar9;
  ulong uVar10;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  *__range3;
  __normal_iterator<Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  __i;
  pointer pTVar11;
  long lVar12;
  TestCaseHandle *pTVar13;
  TestCaseHandle *pTVar14;
  TestCaseHandle *handle;
  pointer pTVar15;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  indexed_tests;
  TestCaseInfoHasher h;
  string local_78;
  ReusableStringStream local_50;
  SourceLineInfo local_40;
  
  iVar7 = (*config->_vptr_IConfig[0x10])(config);
  if (iVar7 == 2) {
    sharedRng();
    uVar8 = (*config->_vptr_IConfig[0x11])(config);
    sharedRng::s_rng.m_state = (ulong)uVar8 * 0x5851f42d4c957f2d + 0x6f1903917447ed96;
    uVar8 = (*config->_vptr_IConfig[0x11])(config);
    local_50.m_index = (size_t)uVar8;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    std::
    vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::reserve((vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
               *)&local_78,
              (long)(unsortedTestCases->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(unsortedTestCases->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4);
    pTVar15 = (unsortedTestCases->
              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (unsortedTestCases->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar15 != pTVar2) {
      do {
        uVar9 = TestCaseInfoHasher::operator()((TestCaseInfoHasher *)&local_50,pTVar15->m_info);
        local_40.file = (char *)CONCAT44(local_40.file._4_4_,uVar9);
        std::
        vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
        ::emplace_back<unsigned_int,Catch::TestCaseHandle_const&>
                  ((vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
                    *)&local_78,(uint *)&local_40,pTVar15);
        pTVar15 = pTVar15 + 1;
      } while (pTVar15 != pTVar2);
    }
    sVar6 = local_78._M_string_length;
    _Var5._M_p = local_78._M_dataplus._M_p;
    if (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length) {
      lVar12 = local_78._M_string_length - (long)local_78._M_dataplus._M_p;
      uVar10 = (lVar12 >> 3) * -0x5555555555555555;
      lVar3 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__1>>
                (local_78._M_dataplus._M_p,local_78._M_string_length,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e
                );
      if (lVar12 < 0x181) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__1>>
                  (_Var5._M_p,sVar6);
      }
      else {
        pTVar13 = (TestCaseHandle *)(_Var5._M_p + 0x180);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__1>>
                  (_Var5._M_p,pTVar13);
        for (; pTVar13 != (TestCaseHandle *)sVar6; pTVar13 = (TestCaseHandle *)&pTVar13[1].m_invoker
            ) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,__gnu_cxx::__ops::_Val_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__1>>
                    (pTVar13);
        }
      }
    }
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::reserve
              (__return_storage_ptr__,
               ((long)(local_78._M_string_length - (long)local_78._M_dataplus._M_p) >> 3) *
               -0x5555555555555555);
    sVar6 = local_78._M_string_length;
    if (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length) {
      pTVar13 = (TestCaseHandle *)(local_78._M_dataplus._M_p + 8);
      do {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>::
          _M_realloc_insert<Catch::TestCaseHandle_const&>
                    ((vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>> *)
                     __return_storage_ptr__,__position,pTVar13);
        }
        else {
          pIVar4 = pTVar13->m_invoker;
          (__position._M_current)->m_info = pTVar13->m_info;
          (__position._M_current)->m_invoker = pIVar4;
          ppTVar1 = &(__return_storage_ptr__->
                     super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
        pTVar14 = pTVar13 + 1;
        pTVar13 = (TestCaseHandle *)&pTVar13[1].m_invoker;
      } while (pTVar14 != (TestCaseHandle *)sVar6);
    }
    if ((TestCaseHandle *)local_78._M_dataplus._M_p != (TestCaseHandle *)0x0) {
      operator_delete(local_78._M_dataplus._M_p,
                      local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
    }
  }
  else if (iVar7 == 1) {
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
    pTVar15 = (__return_storage_ptr__->
              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (__return_storage_ptr__->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pTVar15 != pTVar2) {
      uVar10 = (long)pTVar2 - (long)pTVar15 >> 4;
      lVar3 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__0>>
                (pTVar15,pTVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pTVar2 - (long)pTVar15 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__0>>
                  (pTVar15,pTVar2);
      }
      else {
        pTVar11 = pTVar15 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__0>>
                  (pTVar15,pTVar11);
        for (; pTVar11 != pTVar2; pTVar11 = pTVar11 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,__gnu_cxx::__ops::_Val_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>const&)::__0>>
                    (pTVar11);
        }
      }
    }
  }
  else {
    if (iVar7 != 0) {
      ReusableStringStream::ReusableStringStream(&local_50);
      local_40.file =
           "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
      ;
      local_40.line = 0x1850;
      operator<<(local_50.m_oss,&local_40);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_50.m_oss,": Internal Catch2 error: ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_50.m_oss,"Unknown test order value!",0x19);
      std::__cxx11::stringbuf::str();
      throw_logic_error(&local_78);
    }
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestCaseHandle> sortTests( IConfig const& config, std::vector<TestCaseHandle> const& unsortedTestCases ) {
        switch (config.runOrder()) {
        case TestRunOrder::Declared:
            return unsortedTestCases;

        case TestRunOrder::LexicographicallySorted: {
            std::vector<TestCaseHandle> sorted = unsortedTestCases;
            std::sort(
                sorted.begin(),
                sorted.end(),
                []( TestCaseHandle const& lhs, TestCaseHandle const& rhs ) {
                    return lhs.getTestCaseInfo() < rhs.getTestCaseInfo();
                }
            );
            return sorted;
        }
        case TestRunOrder::Randomized: {
            seedRng(config);
            using TestWithHash = std::pair<TestCaseInfoHasher::hash_t, TestCaseHandle>;

            TestCaseInfoHasher h{ config.rngSeed() };
            std::vector<TestWithHash> indexed_tests;
            indexed_tests.reserve(unsortedTestCases.size());

            for (auto const& handle : unsortedTestCases) {
                indexed_tests.emplace_back(h(handle.getTestCaseInfo()), handle);
            }

            std::sort( indexed_tests.begin(),
                       indexed_tests.end(),
                       []( TestWithHash const& lhs, TestWithHash const& rhs ) {
                           if ( lhs.first == rhs.first ) {
                               return lhs.second.getTestCaseInfo() <
                                      rhs.second.getTestCaseInfo();
                           }
                           return lhs.first < rhs.first;
                       } );

            std::vector<TestCaseHandle> randomized;
            randomized.reserve(indexed_tests.size());

            for (auto const& indexed : indexed_tests) {
                randomized.push_back(indexed.second);
            }

            return randomized;
        }
        }

        CATCH_INTERNAL_ERROR("Unknown test order value!");
    }